

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_resetCStream_internal
                 (ZSTD_CStream *cctx,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_CDict *cdict,ZSTD_CCtx_params params,
                 unsigned_long_long pledgedSrcSize)

{
  size_t sVar1;
  long lVar2;
  ZSTD_CCtx_params *pZVar3;
  undefined8 *puVar4;
  byte bVar5;
  ZSTD_CCtx_params in_stack_ffffffffffffff08;
  ZSTD_compressionParameters local_4c;
  
  bVar5 = 0;
  ZSTD_getCParamsFromCCtxParams(&local_4c,&params,pledgedSrcSize,dictSize);
  params.cParams.targetLength = local_4c.targetLength;
  params.cParams.strategy = local_4c.strategy;
  params.cParams.windowLog = local_4c.windowLog;
  params.cParams.chainLog = local_4c.chainLog;
  pZVar3 = &params;
  puVar4 = (undefined8 *)&stack0xffffffffffffff08;
  for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
    *puVar4 = *(undefined8 *)pZVar3;
    pZVar3 = (ZSTD_CCtx_params *)((long)pZVar3 + (ulong)bVar5 * -0x10 + 8);
    puVar4 = puVar4 + (ulong)bVar5 * -2 + 1;
  }
  sVar1 = ZSTD_compressBegin_internal
                    (cctx,dict,dictSize,dictContentType,ZSTD_dtlm_fast,cdict,
                     in_stack_ffffffffffffff08,pledgedSrcSize,ZSTDb_buffered);
  if (sVar1 < 0xffffffffffffff89) {
    cctx->inToCompress = 0;
    cctx->inBuffPos = 0;
    cctx->inBuffTarget = (ulong)(cctx->blockSize == pledgedSrcSize) + cctx->blockSize;
    cctx->outBuffContentSize = 0;
    cctx->outBuffFlushedSize = 0;
    cctx->streamStage = zcss_load;
    cctx->frameEnded = 0;
    sVar1 = 0;
  }
  return sVar1;
}

Assistant:

static size_t ZSTD_resetCStream_internal(ZSTD_CStream* cctx,
                    const void* const dict, size_t const dictSize, ZSTD_dictContentType_e const dictContentType,
                    const ZSTD_CDict* const cdict,
                    ZSTD_CCtx_params params, unsigned long long const pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_resetCStream_internal");
    /* Finalize the compression parameters */
    params.cParams = ZSTD_getCParamsFromCCtxParams(&params, pledgedSrcSize, dictSize);
    /* params are supposed to be fully validated at this point */
    assert(!ZSTD_isError(ZSTD_checkCParams(params.cParams)));
    assert(!((dict) && (cdict)));  /* either dict or cdict, not both */

    CHECK_F( ZSTD_compressBegin_internal(cctx,
                                         dict, dictSize, dictContentType, ZSTD_dtlm_fast,
                                         cdict,
                                         params, pledgedSrcSize,
                                         ZSTDb_buffered) );

    cctx->inToCompress = 0;
    cctx->inBuffPos = 0;
    cctx->inBuffTarget = cctx->blockSize
                      + (cctx->blockSize == pledgedSrcSize);   /* for small input: avoid automatic flush on reaching end of block, since it would require to add a 3-bytes null block to end frame */
    cctx->outBuffContentSize = cctx->outBuffFlushedSize = 0;
    cctx->streamStage = zcss_load;
    cctx->frameEnded = 0;
    return 0;   /* ready to go */
}